

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Drive.cpp
# Opt level: O2

void __thiscall Storage::Disk::Drive::set_head(Drive *this,int head)

{
  int iVar1;
  __shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2> local_18;
  
  iVar1 = this->available_heads_ + -1;
  if (head <= iVar1) {
    iVar1 = head;
  }
  if (iVar1 != this->head_) {
    this->head_ = iVar1;
    local_18._M_ptr = (element_type *)0x0;
    local_18._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->track_).super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>,
               &local_18);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18._M_refcount);
  }
  return;
}

Assistant:

void Drive::set_head(int head) {
	head = std::min(head, available_heads_ - 1);
	if(head != head_) {
		head_ = head;
		track_ = nullptr;
	}
}